

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall backend::codegen::RegAllocator::alloc_regs(RegAllocator *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  __uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> _Var4;
  _Head_base<0UL,_arm::Inst_*,_false> _Var5;
  element_type *peVar6;
  pointer puVar7;
  iterator __position;
  long lVar8;
  RegAllocator *pRVar9;
  char cVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  const_iterator __position_00;
  int iVar15;
  Tag *in_RSI;
  char *pcVar16;
  Tag *tag;
  Inst *pIVar17;
  ulong uVar18;
  Function *pFVar19;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar20;
  size_type __dnew;
  uint r;
  ostream local_139;
  RegAllocator *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  undefined8 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ulong local_f0;
  Function local_e8;
  _Head_base<0UL,_arm::Inst_*,_false> local_88;
  undefined **local_80;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined2 local_60;
  undefined1 local_5e;
  undefined1 local_58;
  long local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  construct_reg_map(this);
  calc_live_intervals(this);
  local_139 = (ostream)0x0;
  AixLog::operator<<(&local_139,(Severity *)in_RSI);
  local_80 = &PTR__Tag_001eaf88;
  local_68 = 0x755f6765725f6262;
  local_60 = 0x6573;
  local_70 = 10;
  local_5e = 0;
  local_58 = 0;
  local_78 = &local_68;
  AixLog::operator<<((ostream *)&local_80,in_RSI);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
  local_100._M_allocated_capacity = 0x65725f636f6c6c61;
  local_100._8_2_ = 0x7367;
  local_108 = 10;
  local_100._M_local_buf[10] = '\0';
  local_130 = &local_120;
  local_f0 = 0x60;
  local_110 = &local_100;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_f0);
  uVar18 = local_f0;
  local_120._M_allocated_capacity = local_f0;
  pcVar16 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_130 = paVar11;
  memcpy(paVar11,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
         ,0x60);
  paVar11->_M_local_buf[uVar18] = '\0';
  local_e8.name._M_dataplus._M_p = (pointer)&local_e8.name.field_2;
  local_e8._vptr_Function = (_func_int **)&PTR__Function_001eafb8;
  if (local_110 == &local_100) {
    local_e8.name.field_2._8_8_ =
         CONCAT53(local_100._11_5_,CONCAT12(local_100._M_local_buf[10],local_100._8_2_));
  }
  else {
    local_e8.name._M_dataplus._M_p = (pointer)local_110;
  }
  local_e8.name.field_2._M_allocated_capacity = local_100._M_allocated_capacity;
  local_e8.file._M_dataplus._M_p = (pointer)&local_e8.file.field_2;
  local_e8.name._M_string_length = local_108;
  local_108 = 0;
  local_100._M_allocated_capacity = local_100._M_allocated_capacity & 0xffffffffffffff00;
  if (local_130 == &local_120) {
    local_e8.file.field_2._8_8_ = local_120._8_8_;
  }
  else {
    local_e8.file._M_dataplus._M_p = (pointer)local_130;
  }
  local_e8.file.field_2._M_allocated_capacity = local_120._M_allocated_capacity;
  local_e8.file._M_string_length = uVar18;
  local_128 = 0;
  local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
  local_e8.line = 0x11c;
  local_e8.is_null_ = false;
  local_130 = &local_120;
  local_110 = &local_100;
  AixLog::operator<<((ostream *)&local_e8,(Function *)pcVar16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"BB starting point",0x11)
  ;
  cVar10 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  tag = (Tag *)(ulong)(uint)(int)cVar10;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function(&local_e8);
  if (local_130 != &local_120) {
    tag = (Tag *)(local_120._M_allocated_capacity + 1);
    operator_delete(local_130,(ulong)tag);
  }
  if (local_110 != &local_100) {
    tag = (Tag *)(local_100._M_allocated_capacity + 1);
    operator_delete(local_110,(ulong)tag);
  }
  local_80 = &PTR__Tag_001eaf88;
  if (local_78 != &local_68) {
    tag = (Tag *)(local_68 + 1);
    operator_delete(local_78,(ulong)tag);
  }
  p_Var13 = (this->point_bb_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._M_head_impl = (Inst *)&(this->point_bb_map)._M_t._M_impl.super__Rb_tree_header;
  local_138 = this;
  if (p_Var13 != (_Base_ptr)local_88._M_head_impl) {
    do {
      _Var3 = p_Var13[1]._M_color;
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)tag);
      local_80 = &PTR__Tag_001eaf88;
      local_68 = 0x755f6765725f6262;
      local_60 = 0x6573;
      local_70 = 10;
      local_5e = 0;
      local_58 = 0;
      local_78 = &local_68;
      AixLog::operator<<((ostream *)&local_80,tag);
      local_40 = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001eaf58;
      local_38 = 0;
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)tag);
      local_100._M_allocated_capacity = 0x65725f636f6c6c61;
      local_100._8_2_ = 0x7367;
      local_108 = 10;
      local_100._M_local_buf[10] = '\0';
      local_130 = &local_120;
      local_f0 = 0x60;
      local_110 = &local_100;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_f0);
      uVar18 = local_f0;
      local_120._M_allocated_capacity = local_f0;
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_130 = paVar11;
      memcpy(paVar11,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,0x60);
      paVar11->_M_local_buf[uVar18] = '\0';
      local_e8._vptr_Function = (_func_int **)&PTR__Function_001eafb8;
      local_e8.name._M_dataplus._M_p = (pointer)&local_e8.name.field_2;
      if (local_110 == &local_100) {
        local_e8.name.field_2._8_8_ =
             CONCAT53(local_100._11_5_,CONCAT12(local_100._M_local_buf[10],local_100._8_2_));
      }
      else {
        local_e8.name._M_dataplus._M_p = (pointer)local_110;
      }
      local_e8.name.field_2._M_allocated_capacity = local_100._M_allocated_capacity;
      local_e8.name._M_string_length = local_108;
      local_108 = 0;
      local_100._M_allocated_capacity = local_100._M_allocated_capacity & 0xffffffffffffff00;
      local_e8.file._M_dataplus._M_p = (pointer)&local_e8.file.field_2;
      if (local_130 == &local_120) {
        local_e8.file.field_2._8_8_ = local_120._8_8_;
      }
      else {
        local_e8.file._M_dataplus._M_p = (pointer)local_130;
      }
      local_e8.file.field_2._M_allocated_capacity = local_120._M_allocated_capacity;
      local_e8.file._M_string_length = uVar18;
      local_128 = 0;
      local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
      local_e8.line = 0x11e;
      local_e8.is_null_ = false;
      local_130 = &local_120;
      local_110 = &local_100;
      AixLog::operator<<((ostream *)&local_e8,(Function *)pcVar16);
      poVar12 = (ostream *)std::ostream::operator<<(&std::clog,_Var3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," -> ",4);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      tag = (Tag *)(ulong)(uint)(int)cVar10;
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      AixLog::Function::~Function(&local_e8);
      if (local_130 != &local_120) {
        tag = (Tag *)(local_120._M_allocated_capacity + 1);
        operator_delete(local_130,(ulong)tag);
      }
      if (local_110 != &local_100) {
        tag = (Tag *)(local_100._M_allocated_capacity + 1);
        operator_delete(local_110,(ulong)tag);
      }
      local_80 = &PTR__Tag_001eaf88;
      if (local_78 != &local_68) {
        tag = (Tag *)(local_68 + 1);
        operator_delete(local_78,(ulong)tag);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Base_ptr)local_88._M_head_impl);
  }
  pRVar9 = local_138;
  calc_reg_affinity(local_138);
  perform_load_stores(pRVar9);
  pFVar19 = pRVar9->f;
  local_e8.name._M_string_length =
       (size_type)
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar7 = (pRVar9->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8._vptr_Function =
       (_func_int **)
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8.name._M_dataplus._M_p =
       (pointer)(pFVar19->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (pFVar19->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pRVar9->inst_sink).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pFVar19->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar7;
  (pFVar19->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pRVar9->inst_sink).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pRVar9->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar9->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar9->inst_sink).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)&local_e8);
  p_Var14 = (pRVar9->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var4.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
  super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
       (((pRVar9->f->inst).
         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>;
  p_Var1 = &(pRVar9->used_regs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var14 != p_Var1) {
    do {
      local_e8._vptr_Function =
           (_func_int **)CONCAT44(local_e8._vptr_Function._4_4_,p_Var14[1]._M_color);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)((long)_Var4.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                           .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10),
                 (uint *)&local_e8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var1);
  }
  p_Var14 = (local_138->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(local_138->used_regs_temp)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var14 != p_Var2) {
    do {
      local_e8._vptr_Function =
           (_func_int **)CONCAT44(local_e8._vptr_Function._4_4_,p_Var14[1]._M_color);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)((long)_Var4.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                           .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10),
                 (uint *)&local_e8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var2);
  }
  p_Var14 = (local_138->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var5._M_head_impl =
       (local_138->f->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  local_88._M_head_impl =
       (Inst *)_Var4.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  if ((_Rb_tree_header *)p_Var14 != p_Var1) {
    do {
      local_e8._vptr_Function =
           (_func_int **)CONCAT44(local_e8._vptr_Function._4_4_,p_Var14[1]._M_color);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)(_Var5._M_head_impl + 1),(uint *)&local_e8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var1);
  }
  p_Var14 = (local_138->used_regs_temp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var14 != p_Var2) {
    do {
      local_e8._vptr_Function =
           (_func_int **)CONCAT44(local_e8._vptr_Function._4_4_,p_Var14[1]._M_color);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)(_Var5._M_head_impl + 1),(uint *)&local_e8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var2);
  }
  pRVar9 = local_138;
  pFVar19 = local_138->f;
  peVar6 = (pFVar19->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar18 = (long)*(pointer *)
                  ((long)&(peVar6->params).
                          super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ._M_impl.super__Vector_impl_data + 8) -
           (long)(peVar6->params).
                 super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_50._0_4_ = local_88._M_head_impl[3].op;
  local_50._4_1_ = local_88._M_head_impl[3].cond;
  local_50._5_3_ = *(undefined3 *)&local_88._M_head_impl[3].field_0xd;
  local_50 = local_50 << 2;
  iVar15 = local_138->stack_size;
  if (uVar18 < 0x41 && iVar15 == 0) {
    pIVar17 = local_88._M_head_impl + 1;
    pVar20 = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::equal_range((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)pIVar17,&arm::REG_FP);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)pIVar17,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node);
    pVar20 = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::equal_range((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(_Var5._M_head_impl + 1),&arm::REG_FP);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)(_Var5._M_head_impl + 1),(_Base_ptr)pVar20.first._M_node,
                   (_Base_ptr)pVar20.second._M_node);
    iVar15 = pRVar9->stack_size;
    pFVar19 = pRVar9->f;
LAB_00171a84:
    if (iVar15 == 0) {
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::_M_erase(&pFVar19->inst,
                 (pFVar19->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
LAB_00171b39:
      __position_00._M_current =
           (pFVar19->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2;
      if (iVar15 < 0x400) {
        local_e8._vptr_Function = (_func_int **)operator_new(0x38);
        *(undefined4 *)
         &((pointer)local_e8._vptr_Function)[1]._M_t.
          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 10;
        *(undefined1 *)
         ((long)&((pointer)local_e8._vptr_Function)[1]._M_t.
                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t + 4) = 0x10;
        (((pointer)local_e8._vptr_Function)->_M_t).
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed8f0;
        ((pointer)local_e8._vptr_Function)[2]._M_t.
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)0xd0000000d;
        *(undefined1 *)
         &((pointer)local_e8._vptr_Function)[6]._M_t.
          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 1;
        *(int *)&((pointer)local_e8._vptr_Function)[4]._M_t.
                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = iVar15;
        ((pointer)local_e8._vptr_Function)[3]._M_t.
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed820;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(&pFVar19->inst,__position_00,(value_type *)&local_e8);
      }
      else {
        local_e8._vptr_Function = (_func_int **)operator_new(0x38);
        *(undefined4 *)(local_e8._vptr_Function + 1) = 6;
        *(undefined1 *)((long)local_e8._vptr_Function + 0xc) = 0x10;
        *local_e8._vptr_Function = (_func_int *)&PTR_display_001ed930;
        *(undefined4 *)(local_e8._vptr_Function + 2) = 0xc;
        *(undefined1 *)(local_e8._vptr_Function + 6) = 1;
        *(int *)(local_e8._vptr_Function + 4) = iVar15;
        local_e8._vptr_Function[3] = (_func_int *)&PTR_display_001ed820;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(&pFVar19->inst,__position_00,(value_type *)&local_e8);
        if (local_e8._vptr_Function != (_func_int **)0x0) {
          (**(code **)(*local_e8._vptr_Function + 0x10))();
        }
        pFVar19 = local_138->f;
        puVar7 = (pFVar19->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_e8._vptr_Function = (_func_int **)operator_new(0x38);
        *(undefined4 *)
         &((pointer)local_e8._vptr_Function)[5]._M_t.
          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 0xc;
        *(undefined2 *)
         ((long)&((pointer)local_e8._vptr_Function)[5]._M_t.
                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t + 4) = 1;
        *(undefined4 *)
         &((pointer)local_e8._vptr_Function)[1]._M_t.
          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 10;
        *(undefined1 *)
         ((long)&((pointer)local_e8._vptr_Function)[1]._M_t.
                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t + 4) = 0x10;
        (((pointer)local_e8._vptr_Function)->_M_t).
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed8f0;
        ((pointer)local_e8._vptr_Function)[2]._M_t.
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)0xd0000000d;
        *(undefined1 *)
         &((pointer)local_e8._vptr_Function)[6]._M_t.
          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 0;
        ((pointer)local_e8._vptr_Function)[4]._M_t.
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed7c0;
        ((pointer)local_e8._vptr_Function)[3]._M_t.
        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
             (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed820;
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::_M_insert_rval(&pFVar19->inst,puVar7 + 3,(value_type *)&local_e8);
      }
      if ((pointer)local_e8._vptr_Function != (pointer)0x0) {
        (**(code **)((long)(((__uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true>
                              *)local_e8._vptr_Function)->
                           super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>)._M_t +
                    0x10))();
      }
    }
    if (local_138->stack_size != 0) goto LAB_00171cb8;
  }
  else {
    if (uVar18 < 0x41) goto LAB_00171a84;
    puVar7 = (pFVar19->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e8._vptr_Function = (_func_int **)operator_new(0x38);
    *(undefined4 *)
     &((pointer)local_e8._vptr_Function)[1]._M_t.
      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 9;
    *(undefined1 *)
     ((long)&((pointer)local_e8._vptr_Function)[1]._M_t.
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t + 4) = 0x10;
    (((pointer)local_e8._vptr_Function)->_M_t).
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed8f0;
    ((pointer)local_e8._vptr_Function)[2]._M_t.
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)0xb0000000b;
    *(undefined1 *)
     &((pointer)local_e8._vptr_Function)[6]._M_t.
      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 1;
    *(int *)&((pointer)local_e8._vptr_Function)[4]._M_t.
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = (int)local_50;
    ((pointer)local_e8._vptr_Function)[3]._M_t.
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar19->inst,puVar7 + 2,(value_type *)&local_e8);
    if ((pointer)local_e8._vptr_Function != (pointer)0x0) {
      (**(code **)((long)(((__uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> *
                           )local_e8._vptr_Function)->
                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>)._M_t +
                  0x10))();
    }
    iVar15 = local_138->stack_size;
    if (iVar15 != 0) {
      pFVar19 = local_138->f;
      goto LAB_00171b39;
    }
  }
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::_M_erase(&local_138->f->inst,
             (local_138->f->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -2);
LAB_00171cb8:
  if (0x40 < uVar18) {
    pFVar19 = local_138->f;
    puVar7 = (pFVar19->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_e8._vptr_Function = (_func_int **)operator_new(0x38);
    *(undefined4 *)
     &((pointer)local_e8._vptr_Function)[1]._M_t.
      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 10;
    *(undefined1 *)
     ((long)&((pointer)local_e8._vptr_Function)[1]._M_t.
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t + 4) = 0x10;
    (((pointer)local_e8._vptr_Function)->_M_t).
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed8f0;
    ((pointer)local_e8._vptr_Function)[2]._M_t.
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)0xb0000000b;
    *(undefined1 *)
     &((pointer)local_e8._vptr_Function)[6]._M_t.
      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = 1;
    *(int *)&((pointer)local_e8._vptr_Function)[4]._M_t.
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t = (int)local_50;
    ((pointer)local_e8._vptr_Function)[3]._M_t.
    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_insert_rval(&pFVar19->inst,puVar7 + -2,(value_type *)&local_e8);
    if ((pointer)local_e8._vptr_Function != (pointer)0x0) {
      (**(code **)((long)(((__uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> *
                           )local_e8._vptr_Function)->
                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>)._M_t +
                  0x10))();
    }
  }
  pRVar9 = local_138;
  pFVar19 = local_138->f;
  __position._M_current =
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pIVar17 = ((__position._M_current)->_M_t).
            super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  _Var5._M_head_impl =
       (pFVar19->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  lVar8._0_4_ = pIVar17[3].op;
  lVar8._4_1_ = pIVar17[3].cond;
  lVar8._5_3_ = *(undefined3 *)&pIVar17[3].field_0xd;
  if (lVar8 == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_erase(&pFVar19->inst,__position);
  }
  if (*(long *)((long)(_Var5._M_head_impl + 3) + 8) == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::_M_erase(&pRVar9->f->inst,
               (pRVar9->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  return;
}

Assistant:

void RegAllocator::alloc_regs() {
  construct_reg_map();
  calc_live_intervals();

  LOG(TRACE, "bb_reg_use") << "BB starting point" << std::endl;
  for (auto x : point_bb_map) {
    LOG(TRACE, "bb_reg_use") << x.first << " -> " << x.second << std::endl;
  }

  // LOG(TRACE, "bb_reg_use") << "BB Reg use:" << std::endl;
  // for (auto x : bb_used_regs) {
  //   LOG(TRACE, "bb_reg_use") << x.first << " -> ";
  //   for (auto r : x.second) {
  //     display_reg_name(LOG(TRACE, "color_map"), r);
  //     LOG(TRACE, "bb_reg_use") << " ";
  //   }
  //   LOG(TRACE, "bb_reg_use") << std::endl;
  // }
  calc_reg_affinity();

  perform_load_stores();
  f.inst = std::move(inst_sink);

  {
    // Add used reg stuff
    auto &first = f.inst.front();
    auto first_ = static_cast<PushPopInst *>(&*first);
    for (auto r : used_regs) first_->regs.insert(r);
    for (auto r : used_regs_temp) first_->regs.insert(r);
    auto &last = f.inst.back();
    auto last_ = static_cast<PushPopInst *>(&*last);
    for (auto r : used_regs) last_->regs.insert(r);
    for (auto r : used_regs_temp) last_->regs.insert(r);

    auto use_stack_param = f.ty.get()->params.size() > 4;
    auto offset_size = (first_->regs.size()) * 4;

    if (!use_stack_param && stack_size == 0) {
      first_->regs.erase(REG_FP);
      last_->regs.erase(REG_FP);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Add, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }

    if (stack_size == 0) {
      // sp does not change.
      if (!use_stack_param) {
        // no need to use fp
        f.inst.erase(f.inst.begin() + 1);
      }
    } else if (stack_size < 1024) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 Operand2(stack_size)));
    } else {
      f.inst.insert(
          f.inst.begin() + 2,
          std::make_unique<Arith2Inst>(OpCode::Mov, 12, Operand2(stack_size)));
      f.inst.insert(f.inst.begin() + 3,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 RegisterOperand(12)));
    }

    if (stack_size == 0) {
      // sp hasn't change throught function
      f.inst.erase(f.inst.end() - 2);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.end() - 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }
    {
      auto &first = f.inst.front();
      auto first_ = static_cast<PushPopInst *>(&*first);
      auto &last = f.inst.back();
      auto last_ = static_cast<PushPopInst *>(&*last);
      if (first_->regs.empty()) f.inst.erase(f.inst.begin());
      if (last_->regs.empty()) f.inst.erase(f.inst.end() - 1);
    }
  }
}